

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyply.h
# Opt level: O2

void __thiscall tinyply::PlyFile::PlyFileImpl::write_binary_internal(PlyFileImpl *this,ostream *os)

{
  long *plVar1;
  pointer pPVar2;
  long lVar3;
  size_t *srcOffset;
  ulong uVar4;
  uint8_t *src;
  pointer pPVar5;
  long lVar6;
  PlyFileImpl *this_00;
  __node_base_ptr p_Var7;
  long lVar8;
  size_t *stride;
  PlyProperty *p;
  pointer pPVar9;
  undefined1 local_98 [8];
  vector<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>,_std::allocator<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>_>_>
  element_property_lookup;
  size_t dummyCount;
  pointer local_70;
  __node_base_ptr local_68;
  ulong local_60;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  undefined4 local_34 [2];
  uint8_t listSize [4];
  
  this->isBinary = true;
  local_48 = (pointer)os;
  write_header(this,os);
  local_34[0] = 0;
  element_property_lookup.
  super__Vector_base<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>,_std::allocator<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (PlyFileImpl *)local_98;
  make_property_lookup_table
            ((vector<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>,_std::allocator<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>_>_>
              *)this_00,this);
  pPVar2 = (this->elements).
           super__Vector_base<tinyply::PlyElement,_std::allocator<tinyply::PlyElement>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_50 = (this->elements).
             super__Vector_base<tinyply::PlyElement,_std::allocator<tinyply::PlyElement>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_40 = (pointer)0x0;
  while (pPVar2 != local_50) {
    p_Var7 = (__node_base_ptr)((long)local_40 * 0x18);
    uVar4 = 0;
    local_68 = p_Var7;
    local_58 = pPVar2;
    while (uVar4 < local_58->size) {
      pPVar5 = (local_58->properties).
               super__Vector_base<tinyply::PlyProperty,_std::allocator<tinyply::PlyProperty>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      lVar6 = 0;
      local_70 = pPVar5;
      local_60 = uVar4;
      for (pPVar9 = (local_58->properties).
                    super__Vector_base<tinyply::PlyProperty,_std::allocator<tinyply::PlyProperty>_>.
                    _M_impl.super__Vector_impl_data._M_start; pPVar2 = local_48, pPVar9 != pPVar5;
          pPVar9 = pPVar9 + 1) {
        lVar8 = *(long *)((long)&p_Var7->_M_nxt +
                         (long)(_Vector_base<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>
                                *)local_98);
        lVar3 = lVar6 * 0x20;
        plVar1 = *(long **)(lVar8 + lVar3);
        if (plVar1 != (long *)0x0 && *(char *)(lVar8 + 8 + lVar3) == '\0') {
          lVar8 = lVar8 + lVar3;
          if (pPVar9->isList == true) {
            local_34[0] = (undefined4)pPVar9->listCount;
            write_property_binary
                      (this_00,(ostream *)local_48,(uint8_t *)local_34,
                       (size_t *)
                       &element_property_lookup.
                        super__Vector_base<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>,_std::allocator<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_t *)(lVar8 + 0x18))
            ;
            srcOffset = (size_t *)plVar1[2];
            src = (uint8_t *)(*(long *)(*plVar1 + 8) + *srcOffset);
            dummyCount = pPVar9->listCount * *(long *)(lVar8 + 0x10);
            stride = &dummyCount;
            p_Var7 = local_68;
          }
          else {
            srcOffset = (size_t *)plVar1[2];
            src = (uint8_t *)(*(long *)(*plVar1 + 8) + *srcOffset);
            stride = (size_t *)(lVar8 + 0x10);
          }
          write_property_binary(this_00,(ostream *)pPVar2,src,srcOffset,stride);
          lVar6 = lVar6 + 1;
          pPVar5 = local_70;
        }
      }
      uVar4 = local_60 + 1;
    }
    local_40 = (pointer)((long)&(local_40->_M_dataplus)._M_p + 1);
    pPVar2 = local_58 + 1;
  }
  std::
  vector<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>,_std::allocator<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>_>_>
  ::~vector((vector<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>,_std::allocator<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>_>_>
             *)local_98);
  return;
}

Assistant:

void PlyFile::PlyFileImpl::write_binary_internal(std::ostream & os) noexcept
{
    isBinary = true;

    write_header(os);

    uint8_t listSize[4] = { 0, 0, 0, 0 };
    size_t dummyCount = 0;

    auto element_property_lookup = make_property_lookup_table();

    size_t element_idx = 0;
    for (auto & e : elements)
    {
        for (size_t i = 0; i < e.size; ++i)
        {
            size_t property_index = 0;
            for (auto & p : e.properties)
            {
                auto & f = element_property_lookup[element_idx][property_index];
                auto * helper = f.helper;
                if (f.skip || helper == nullptr) continue;

                if (p.isList)
                {
                    std::memcpy(listSize, &p.listCount, sizeof(uint32_t));
                    write_property_binary(os, listSize, dummyCount, f.list_stride);
                    write_property_binary(os, (helper->data->buffer.get_const() + helper->cursor->byteOffset), helper->cursor->byteOffset, f.prop_stride * p.listCount);
                }
                else
                {
                    write_property_binary(os, (helper->data->buffer.get_const() + helper->cursor->byteOffset), helper->cursor->byteOffset, f.prop_stride);
                }
                property_index++;
            }
        }
        element_idx++;
    }
}